

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldStringAccessor::Swap
          (RepeatedPtrFieldStringAccessor *this,Field *data,RepeatedFieldAccessor *other_mutator,
          Field *other_data)

{
  undefined1 uVar1;
  int iVar2;
  long lVar3;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value;
  int iVar4;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  RepeatedPtrFieldBase local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((RepeatedFieldAccessor *)this == other_mutator) {
    if (data != other_data) {
      if (*(long *)((long)data + 0x10) != *(long *)((long)other_data + 0x10)) {
        RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)data,(RepeatedPtrFieldBase *)other_data);
        return;
      }
      lVar3 = 0;
      do {
        uVar1 = *(undefined1 *)((long)data + lVar3);
        *(undefined1 *)((long)data + lVar3) = *(undefined1 *)((long)other_data + lVar3);
        *(undefined1 *)((long)other_data + lVar3) = uVar1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x10);
    }
  }
  else {
    local_68.tagged_rep_or_elem_ = (void *)0x0;
    local_68.current_size_ = 0;
    local_68.capacity_proxy_ = 0;
    local_68.arena_ = (Arena *)0x0;
    if (&local_68 != (RepeatedPtrFieldBase *)data) {
      if (*(long *)((long)data + 0x10) == 0) {
        lVar3 = 0;
        do {
          uVar1 = *(undefined1 *)((long)&local_68.tagged_rep_or_elem_ + lVar3);
          *(undefined1 *)((long)&local_68.tagged_rep_or_elem_ + lVar3) =
               *(undefined1 *)((long)data + lVar3);
          *(undefined1 *)((long)data + lVar3) = uVar1;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 0x10);
      }
      else {
        RepeatedPtrFieldBase::
        SwapFallback<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  (&local_68,(RepeatedPtrFieldBase *)data);
      }
    }
    iVar2 = (**(code **)(*(long *)other_mutator + 8))(other_mutator,other_data);
    if (0 < iVar2) {
      iVar4 = 0;
      do {
        RepeatedFieldAccessor::Get<std::__cxx11::string>(&local_50,other_mutator,other_data,iVar4);
        RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                  ((RepeatedFieldAccessor *)this,data,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        iVar4 = iVar4 + 1;
      } while (iVar2 != iVar4);
    }
    lVar3 = (**(code **)((long)*this + 0x80))(this,data);
    iVar2 = *(int *)(lVar3 + 8);
    (**(code **)(*(long *)other_mutator + 0x18))(other_mutator,other_data);
    if (0 < iVar2) {
      iVar4 = 0;
      do {
        value = RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                          (&local_68,iVar4);
        RepeatedFieldAccessor::Add<std::__cxx11::string,std::__cxx11::string>
                  (other_mutator,other_data,value);
        iVar4 = iVar4 + 1;
      } while (iVar2 != iVar4);
    }
    RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&local_68);
  }
  return;
}

Assistant:

void Swap(Field* data, const internal::RepeatedFieldAccessor* other_mutator,
            Field* other_data) const override {
    if (this == other_mutator) {
      MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
    } else {
      RepeatedPtrField<std::string> tmp;
      tmp.Swap(MutableRepeatedField(data));
      int other_size = other_mutator->Size(other_data);
      for (int i = 0; i < other_size; ++i) {
        Add<std::string>(data, other_mutator->Get<std::string>(other_data, i));
      }
      int size = Size(data);
      other_mutator->Clear(other_data);
      for (int i = 0; i < size; ++i) {
        other_mutator->Add<std::string>(other_data, tmp.Get(i));
      }
    }
  }